

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiView.cpp
# Opt level: O2

bool Imf_3_4::areCounterparts(string *channel1,string *channel2,StringVector *multiView)

{
  pointer pbVar1;
  __type _Var2;
  bool bVar3;
  int iVar4;
  StringVector *pSVar5;
  StringVector *pSVar6;
  char c;
  char c_00;
  long lVar7;
  ulong uVar8;
  long lVar9;
  StringVector chan2;
  StringVector chan1;
  StringVector local_e8;
  StringVector local_d0;
  ulong local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pSVar5 = &local_e8;
  pSVar6 = &local_e8;
  std::__cxx11::string::string((string *)&local_70,(string *)channel1);
  anon_unknown_5::parseString(&local_d0,&local_70,c);
  std::__cxx11::string::~string((string *)&local_70);
  pbVar1 = local_d0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&local_b0,(string *)channel2);
  anon_unknown_5::parseString(&local_e8,&local_b0,c_00);
  std::__cxx11::string::~string((string *)&local_b0);
  lVar9 = (long)local_e8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_e8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (local_d0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar1 && lVar9 != 0) {
    lVar7 = (long)local_d0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
    uVar8 = lVar7 >> 5;
    if (1 < uVar8) {
      iVar4 = anon_unknown_5::viewNum
                        ((string *)
                         ((long)local_d0.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar7 + -0x40),multiView
                        );
      if (iVar4 == -1) goto LAB_0018ec47;
    }
    local_b8 = lVar9 >> 5;
    if (1 < local_b8) {
      iVar4 = anon_unknown_5::viewNum
                        ((string *)
                         ((long)local_e8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar9 + -0x40),multiView
                        );
      if (iVar4 == -1) goto LAB_0018ec47;
    }
    viewFromChannelName(&local_90,channel1,multiView);
    viewFromChannelName(&local_50,channel2,multiView);
    _Var2 = std::operator==(&local_90,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    if (!_Var2) {
      if (lVar7 == 0x20) {
        if (lVar9 == 0x40) {
          pSVar6 = &local_d0;
LAB_0018ec99:
          _Var2 = std::operator==((pSVar6->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start,
                                  (pSVar5->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1);
          goto LAB_0018ec49;
        }
      }
      else if (lVar9 == 0x20) {
        pSVar5 = &local_d0;
        if (lVar7 == 0x40) goto LAB_0018ec99;
      }
      else if (uVar8 == local_b8) {
        lVar9 = 0;
        while( true ) {
          _Var2 = uVar8 == 0;
          if (_Var2) break;
          if (uVar8 != 2) {
            bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&((local_d0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               _M_dataplus)._M_p + lVar9),
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&((local_e8.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               _M_dataplus)._M_p + lVar9));
            if (bVar3) break;
          }
          lVar9 = lVar9 + 0x20;
          uVar8 = uVar8 - 1;
        }
        goto LAB_0018ec49;
      }
    }
  }
LAB_0018ec47:
  _Var2 = false;
LAB_0018ec49:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d0);
  return _Var2;
}

Assistant:

bool
areCounterparts (
    const string&       channel1,
    const string&       channel2,
    const StringVector& multiView)
{
    //
    // Given two channels, return true if they are the same
    // channel in two different views.
    //

    StringVector chan1 = parseString (channel1);
    size_t       size1 = chan1.size (); // number of SECTIONS in string
                                        // name (not string length)

    StringVector chan2 = parseString (channel2);
    size_t       size2 = chan2.size ();

    if (size1 == 0 || size2 == 0) return false;

    //
    // channel1 and channel2 can't be counterparts
    // if either channel is in no view.
    //

    if (size1 > 1 && viewNum (chan1[size1 - 2], multiView) == -1) return false;

    if (size2 > 1 && viewNum (chan2[size2 - 2], multiView) == -1) return false;

    if (viewFromChannelName (channel1, multiView) ==
        viewFromChannelName (channel2, multiView))
    {
        //
        // channel1 and channel2 are not counterparts
        // if they are in the same view.
        //

        return false;
    }

    if (size1 == 1)
    {
        //
        // channel1 is a default channel - the channels will only be
        // counterparts if channel2 is of the form <view>.<channel1>
        //

        return size2 == 2 && chan1[0] == chan2[1];
    }

    if (size2 == 1)
    {
        //
        // channel2 is a default channel - the channels will only be
        // counterparts if channel1 is of the form <view>.<channel2>
        //

        return size1 == 2 && chan2[0] == chan1[1];
    }

    //
    // Neither channel is a default channel.  To be counterparts both
    // channel names must have the same number of components, and
    // all components except the penultimate one must be the same.
    //

    if (size1 != size2) return false;

    for (size_t i = 0; i < size1; ++i)
    {
        if (i != size1 - 2 && chan1[i] != chan2[i]) return false;
    }

    return true;
}